

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

FunctionEntryPointInfo * __thiscall
Js::FunctionBody::GetEntryPointFromNativeAddress(FunctionBody *this,DWORD_PTR codeAddress)

{
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar1;
  FunctionEntryPointInfo *this_00;
  bool bVar2;
  FunctionEntryPointInfo *pFVar3;
  int i;
  long lVar4;
  
  pSVar1 = (this->entryPoints).ptr;
  if (pSVar1 == (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                 *)0x0) {
    pFVar3 = (FunctionEntryPointInfo *)0x0;
  }
  else {
    pFVar3 = (FunctionEntryPointInfo *)0x0;
    for (lVar4 = 0;
        lVar4 < (pSVar1->
                super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ).
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                .count; lVar4 = lVar4 + 1) {
      this_00 = (FunctionEntryPointInfo *)
                (((pSVar1->
                  super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ).
                  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                  .buffer.ptr[lVar4].ptr)->super_RecyclerWeakReferenceBase).strongRef;
      if (this_00 != (FunctionEntryPointInfo *)0x0) {
        bVar2 = EntryPointInfo::IsInNativeAddressRange((EntryPointInfo *)this_00,codeAddress);
        if (bVar2) {
          pFVar3 = this_00;
        }
      }
    }
  }
  return pFVar3;
}

Assistant:

FunctionEntryPointInfo * FunctionBody::GetEntryPointFromNativeAddress(DWORD_PTR codeAddress)
    {
        FunctionEntryPointInfo * entryPoint = nullptr;
        this->MapEntryPoints([&entryPoint, &codeAddress](int index, FunctionEntryPointInfo * currentEntryPoint)
        {
            // We need to do a second check for IsNativeCode because the entry point could be in the process of
            // being recorded on the background thread
            if (currentEntryPoint->IsInNativeAddressRange(codeAddress))
            {
                entryPoint = currentEntryPoint;
            }
        });

        return entryPoint;
    }